

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# res0.c
# Opt level: O0

int res1_forward(oggpack_buffer *opb,vorbis_block *vb,vorbis_look_residue *vl,int **in,int *nonzero,
                int ch,long **partword,int submap)

{
  int local_44;
  int local_40;
  int used;
  int i;
  int ch_local;
  int *nonzero_local;
  int **in_local;
  vorbis_look_residue *vl_local;
  vorbis_block *vb_local;
  oggpack_buffer *opb_local;
  
  local_44 = 0;
  for (local_40 = 0; local_40 < ch; local_40 = local_40 + 1) {
    if (nonzero[local_40] != 0) {
      in[local_44] = in[local_40];
      local_44 = local_44 + 1;
    }
  }
  if (local_44 == 0) {
    opb_local._4_4_ = 0;
  }
  else {
    opb_local._4_4_ = _01forward(opb,vl,in,local_44,partword,_encodepart);
  }
  return opb_local._4_4_;
}

Assistant:

int res1_forward(oggpack_buffer *opb,vorbis_block *vb,vorbis_look_residue *vl,
                 int **in,int *nonzero,int ch, long **partword, int submap){
  int i,used=0;
  (void)vb;
  for(i=0;i<ch;i++)
    if(nonzero[i])
      in[used++]=in[i];

  if(used){
#ifdef TRAIN_RES
    return _01forward(opb,vl,in,used,partword,_encodepart,submap);
#else
    (void)submap;
    return _01forward(opb,vl,in,used,partword,_encodepart);
#endif
  }else{
    return(0);
  }
}